

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

_Bool ask_word(char *word_res,size_t min_len,size_t max_len)

{
  char cVar1;
  size_t sVar2;
  __int32_t **pp_Var3;
  size_t sVar4;
  
  do {
    printf("Please enter a word of at least %zu letters: ",min_len);
    fgets(word_res,(int)max_len,_stdin);
    if (*word_res == '\n') break;
    sVar2 = strlen(word_res);
    if (sVar2 - 1 < min_len) {
      puts("Your word is too small!");
    }
    sVar2 = strlen(word_res);
  } while (sVar2 - 1 < min_len);
  if (max_len != 0) {
    sVar4 = 0;
    do {
      cVar1 = word_res[sVar4];
      if ((cVar1 == '\n') || (cVar1 == '\0')) break;
      pp_Var3 = __ctype_toupper_loc();
      word_res[sVar4] = (char)(*pp_Var3)[cVar1];
      sVar4 = sVar4 + 1;
    } while (max_len != sVar4);
  }
  return *word_res != '\n';
}

Assistant:

bool ask_word(char* word_res, const size_t min_len, const size_t max_len) {
  do {
    printf("Please enter a word of at least %zu letters: ", min_len);
    fgets(word_res, (int)max_len, stdin);
    if (word_res[0] == '\n') break;
    if (strlen(word_res) - 1 < min_len) {
      printf("Your word is too small!\n");
    }
  } while (strlen(word_res) - 1 < min_len);

  for (size_t n = 0; n < max_len && word_res[n] != 0 && word_res[n] != '\n'; n++) {
    word_res[n] = (char)toupper(word_res[n]);
  }

  return word_res[0] != '\n';
}